

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall
adios2::core::Engine::Engine
          (Engine *this,string *engineType,IO *io,string *name,Mode openMode,Comm *comm,char *md,
          size_t mdsize)

{
  UserOptions *pUVar1;
  HostOptions *pHVar2;
  allocator local_59;
  string *local_58;
  string local_50;
  
  this->_vptr_Engine = (_func_int **)&PTR__Engine_00819828;
  local_58 = &this->m_EngineType;
  std::__cxx11::string::string((string *)local_58,(string *)engineType);
  this->m_IO = io;
  std::__cxx11::string::string((string *)&this->m_Name,(string *)name);
  this->m_OpenMode = openMode;
  helper::Comm::Comm(&this->m_Comm,comm);
  pUVar1 = ADIOS::GetUserOptions(io->m_ADIOS);
  this->m_UserOptions = pUVar1;
  pHVar2 = ADIOS::GetHostOptions_abi_cxx11_(io->m_ADIOS);
  this->m_HostOptions = pHVar2;
  this->m_AdvanceStatus = OK;
  this->m_IsClosed = false;
  this->m_Steps = 0;
  this->m_IsOpen = false;
  this->m_FailVerbose = true;
  this->m_WriterDefinitionsLocked = false;
  this->m_ReaderSelectionsLocked = false;
  this->m_BetweenStepPairs = false;
  (this->m_CreatedVars)._M_h._M_buckets = &(this->m_CreatedVars)._M_h._M_single_bucket;
  (this->m_CreatedVars)._M_h._M_bucket_count = 1;
  (this->m_CreatedVars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_CreatedVars)._M_h._M_element_count = 0;
  (this->m_CreatedVars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_CreatedVars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_CreatedVars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&local_50,"Engine with metadata in memory",&local_59);
  ThrowUp(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Engine::Engine(const std::string engineType, IO &io, const std::string &name, const Mode openMode,
               helper::Comm comm, const char *md, const size_t mdsize)
: m_EngineType(engineType), m_IO(io), m_Name(name), m_OpenMode(openMode), m_Comm(std::move(comm)),
  m_UserOptions(io.m_ADIOS.GetUserOptions()), m_HostOptions(io.m_ADIOS.GetHostOptions())
{
    ThrowUp("Engine with metadata in memory");
}